

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.c
# Opt level: O1

Boolean isLegalUTF8(UTF8 *source,int length)

{
  byte bVar1;
  byte bVar2;
  UTF8 *pUVar3;
  
  if (3 < length - 1U) {
    return '\0';
  }
  pUVar3 = source + length;
  switch(length) {
  case 1:
    goto switchD_008481bd_caseD_1;
  case 4:
    if (-0x41 < (char)pUVar3[-1]) {
      return '\0';
    }
    pUVar3 = pUVar3 + -1;
  case 3:
    if (-0x41 < (char)pUVar3[-1]) {
      return '\0';
    }
    pUVar3 = pUVar3 + -1;
  }
  bVar1 = pUVar3[-1];
  if (0xbf < bVar1) {
    return '\0';
  }
  bVar2 = *source;
  if (bVar2 < 0xf0) {
    if (bVar2 == 0xe0) {
      if (bVar1 < 0xa0) {
        return '\0';
      }
      goto switchD_008481bd_caseD_1;
    }
    if (bVar2 == 0xed) {
      if (0x9f < bVar1) {
        return '\0';
      }
      goto switchD_008481bd_caseD_1;
    }
  }
  else {
    if (bVar2 == 0xf0) {
      if (bVar1 < 0x90) {
        return '\0';
      }
      goto switchD_008481bd_caseD_1;
    }
    if (bVar2 == 0xf4) {
      if (0x8f < bVar1) {
        return '\0';
      }
      goto switchD_008481bd_caseD_1;
    }
  }
  if (-1 < (char)bVar1) {
    return '\0';
  }
switchD_008481bd_caseD_1:
  if ((char)*source < -0x3e) {
    return '\0';
  }
  return *source < 0xf5;
}

Assistant:

static Boolean isLegalUTF8(const UTF8 *source, int length) {
    UTF8 a;
    const UTF8 *srcptr = source+length;
    switch (length) {
    default: return false;
	/* Everything else falls through when "true"... */
    case 4: if ((a = (*--srcptr)) < 0x80 || a > 0xBF) return false;
    case 3: if ((a = (*--srcptr)) < 0x80 || a > 0xBF) return false;
    case 2: if ((a = (*--srcptr)) > 0xBF) return false;

	switch (*source) {
	    /* no fall-through in this inner switch */
	    case 0xE0: if (a < 0xA0) return false; break;
	    case 0xED: if (a > 0x9F) return false; break;
	    case 0xF0: if (a < 0x90) return false; break;
	    case 0xF4: if (a > 0x8F) return false; break;
	    default:   if (a < 0x80) return false;
	}

    case 1: if (*source >= 0x80 && *source < 0xC2) return false;
    }
    if (*source > 0xF4) return false;
    return true;
}